

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::internal::UnitTestOptions::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  bool bVar2;
  
  while( true ) {
    for (; cVar1 = *pattern, cVar1 == '*'; pattern = pattern + 1) {
      if ((*str != '\0') && (bVar2 = PatternMatchesString(pattern,str + 1), bVar2)) {
        return true;
      }
    }
    if (cVar1 == '\0') break;
    if (cVar1 == '?') {
      if (*str == '\0') {
        return false;
      }
    }
    else {
      if (cVar1 == ':') break;
      if (cVar1 != *str) {
        return false;
      }
    }
    pattern = pattern + 1;
    str = str + 1;
  }
  return *str == '\0';
}

Assistant:

bool UnitTestOptions::PatternMatchesString(const char *pattern,
                                           const char *str) {
  switch (*pattern) {
    case '\0':
    case ':':  // Either ':' or '\0' marks the end of the pattern.
      return *str == '\0';
    case '?':  // Matches any single character.
      return *str != '\0' && PatternMatchesString(pattern + 1, str + 1);
    case '*':  // Matches any string (possibly empty) of characters.
      return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
          PatternMatchesString(pattern + 1, str);
    default:  // Non-special character.  Matches itself.
      return *pattern == *str &&
          PatternMatchesString(pattern + 1, str + 1);
  }
}